

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMethods.cpp
# Opt level: O0

void __thiscall
slang::ast::builtins::StringCompareMethod::StringCompareMethod
          (StringCompareMethod *this,Compilation *comp,string *name,bool ignoreCase)

{
  initializer_list<const_slang::ast::Type_*> __l;
  Type *returnType;
  allocator<const_slang::ast::Type_*> local_59;
  Type *local_58;
  iterator local_50;
  size_type local_48;
  vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> local_40;
  byte local_21;
  string *psStack_20;
  bool ignoreCase_local;
  string *name_local;
  Compilation *comp_local;
  StringCompareMethod *this_local;
  
  local_21 = ignoreCase;
  psStack_20 = name;
  name_local = (string *)comp;
  comp_local = (Compilation *)this;
  local_58 = Compilation::getStringType(comp);
  local_50 = &local_58;
  local_48 = 1;
  std::allocator<const_slang::ast::Type_*>::allocator(&local_59);
  __l._M_len = local_48;
  __l._M_array = local_50;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            (&local_40,__l,&local_59);
  returnType = Compilation::getIntType((Compilation *)name_local);
  SimpleSystemSubroutine::SimpleSystemSubroutine
            (&this->super_SimpleSystemSubroutine,name,Function,1,&local_40,returnType,true,false);
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::~vector
            (&local_40);
  std::allocator<const_slang::ast::Type_*>::~allocator(&local_59);
  (this->super_SimpleSystemSubroutine).super_SystemSubroutine._vptr_SystemSubroutine =
       (_func_int **)&PTR__StringCompareMethod_00917050;
  (this->super_SimpleSystemSubroutine).field_0x62 = local_21 & 1;
  return;
}

Assistant:

StringCompareMethod(Compilation& comp, const std::string& name, bool ignoreCase) :
        SimpleSystemSubroutine(name, SubroutineKind::Function, 1, {&comp.getStringType()},
                               comp.getIntType(), true),
        ignoreCase(ignoreCase) {}